

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::SerialArena::Init(SerialArena *this,ArenaBlock *b,size_t offset)

{
  size_t sVar1;
  char *ptr;
  char *pcVar2;
  size_t offset_local;
  ArenaBlock *b_local;
  SerialArena *this_local;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  
  ptr = ArenaBlock::Pointer(b,offset);
  pcVar2 = ArenaBlock::Limit(b);
  set_ptr(this,ptr);
  this->prefetch_ptr_ = ptr;
  this->limit_ = pcVar2;
  std::atomic<google::protobuf::internal::ArenaBlock_*>::store(&this->head_,b,memory_order_relaxed);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->space_used_).super___atomic_base<unsigned_long>._M_i = 0;
  sVar1 = b->size;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->space_allocated_).super___atomic_base<unsigned_long>._M_i = sVar1;
  this->cached_block_length_ = '\0';
  this->cached_blocks_ = (CachedBlock **)0x0;
  std::atomic<google::protobuf::internal::StringBlock_*>::store
            (&this->string_block_,(__pointer_type)0x0,memory_order_relaxed);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = 0;
  return;
}

Assistant:

void SerialArena::Init(ArenaBlock* b, size_t offset) {
  set_range(b->Pointer(offset), b->Limit());
  head_.store(b, std::memory_order_relaxed);
  space_used_.store(0, std::memory_order_relaxed);
  space_allocated_.store(b->size, std::memory_order_relaxed);
  cached_block_length_ = 0;
  cached_blocks_ = nullptr;
  string_block_.store(nullptr, std::memory_order_relaxed);
  string_block_unused_.store(0, std::memory_order_relaxed);
}